

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar4;
  template_classifier *this;
  ostream *poVar5;
  double dVar6;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  Mat *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1_1;
  Mat *x;
  iterator __end1;
  iterator __begin1;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *__range1;
  timer t;
  int bads_right;
  int goods_right;
  int total;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bads;
  vector<cv::Mat,_std::allocator<cv::Mat>_> goods;
  classifier classifier;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *in_stack_fffffffffffffde8;
  __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
  *in_stack_fffffffffffffdf0;
  timer *in_stack_fffffffffffffe00;
  Mat *in_stack_fffffffffffffe78;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  string *in_stack_fffffffffffffe88;
  template_classifier *in_stack_fffffffffffffe90;
  allocator *paVar10;
  __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> local_148;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_140;
  string *in_stack_fffffffffffffec8;
  __normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> local_128;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_120;
  int local_110;
  int local_10c;
  int local_108;
  allocator local_101;
  string local_100 [32];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_e0;
  allocator local_c1;
  string local_c0 [32];
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_a0;
  allocator local_71;
  string local_70 [108];
  int local_4;
  size_type sVar3;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"../armor",&local_71);
  sp::template_classifier::template_classifier(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"../data/positive",&local_c1);
  get_test_src(in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  paVar10 = &local_101;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"../data/negative",paVar10);
  get_test_src(in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_a0);
  iVar2 = (int)sVar3;
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_e0);
  local_108 = iVar2 + (int)sVar3;
  local_10c = 0;
  local_110 = 0;
  timer::timer((timer *)in_stack_fffffffffffffdf0);
  local_120 = &local_a0;
  local_128._M_current =
       (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(in_stack_fffffffffffffde8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffdf0,
                       (__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator*(&local_128);
    in_stack_fffffffffffffe87 =
         sp::template_classifier::boolean_forward
                   ((template_classifier *)
                    CONCAT17(in_stack_fffffffffffffe87,
                             CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
                    in_stack_fffffffffffffe78);
    local_10c = (uint)(byte)in_stack_fffffffffffffe87 + local_10c;
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&local_128);
  }
  local_140 = &local_e0;
  local_148._M_current =
       (Mat *)std::vector<cv::Mat,_std::allocator<cv::Mat>_>::begin(in_stack_fffffffffffffde8);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::end(in_stack_fffffffffffffde8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffdf0,
                       (__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>
                        *)in_stack_fffffffffffffde8);
    if (!bVar1) break;
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator*(&local_148);
    in_stack_fffffffffffffe86 =
         sp::template_classifier::boolean_forward
                   ((template_classifier *)
                    CONCAT17(in_stack_fffffffffffffe87,
                             CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)),
                    in_stack_fffffffffffffe78);
    local_110 = (uint)((in_stack_fffffffffffffe86 ^ 0xff) & 1) + local_110;
    __gnu_cxx::__normal_iterator<cv::Mat_*,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::
    operator++(&local_148);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Average bench time: ");
  dVar6 = timer::milli_cnt(in_stack_fffffffffffffe00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6 / (double)local_108);
  std::operator<<(poVar4," ms\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"goods right: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10c);
  poVar4 = std::operator<<(poVar4," / ");
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_a0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM1_Qa;
  auVar7 = auVar8._0_16_;
  poVar4 = std::operator<<(poVar4," ~ ");
  dVar6 = (double)local_10c;
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_a0);
  auVar7 = vcvtusi2sd_avx512f(auVar7,sVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(dVar6 / auVar7._0_8_) * 100.0);
  std::operator<<(poVar4," %\n");
  poVar4 = std::operator<<((ostream *)&std::cout,"bads  right: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_110);
  poVar4 = std::operator<<(poVar4," / ");
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_e0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
  auVar9._8_56_ = extraout_var_00;
  auVar9._0_8_ = extraout_XMM1_Qa_00;
  auVar7 = auVar9._0_16_;
  poVar4 = std::operator<<(poVar4," ~ ");
  dVar6 = (double)local_110;
  sVar3 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(&local_e0);
  auVar7 = vcvtusi2sd_avx512f(auVar7,sVar3);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(dVar6 / auVar7._0_8_) * 100.0);
  std::operator<<(poVar4," %\n");
  this = (template_classifier *)std::operator<<((ostream *)&std::cout,"Total accuracy: ");
  poVar5 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)this,((double)(local_10c + local_110) / (double)local_108) * 100.0)
  ;
  std::operator<<(poVar5," %\n");
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)poVar4);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)poVar4);
  sp::template_classifier::~template_classifier(this);
  return local_4;
}

Assistant:

int main()
{
	sp::classifier classifier("../armor");
	// classifier.debug_prepared_show(cv::imread("../armor/positive/T2.png", cv::IMREAD_GRAYSCALE));
	// cv::waitKey();
	auto goods = get_test_src("../data/positive");
	auto bads  = get_test_src("../data/negative");

	int total = goods.size() + bads.size();
	int goods_right = 0;
	int bads_right  = 0;

	// @@@ test time.
	timer t;

	for(auto&& x : goods)
		goods_right += classifier.boolean_forward(x);
	for(auto&& x : bads )
		bads_right  += !classifier.boolean_forward(x);

	std::cout << "Average bench time: " << t.milli_cnt() / total << " ms\n";

	std::cout << "goods right: " << goods_right << " / " << goods.size() << " ~ " << static_cast<double>(goods_right) / goods.size() * 100 << " %\n";
	std::cout << "bads  right: " << bads_right  << " / " << bads.size()  << " ~ " << static_cast<double>(bads_right )  / bads.size() * 100<< " %\n";
	std::cout << "Total accuracy: " << static_cast<double>(goods_right + bads_right) / total * 100 << " %\n";

}